

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

int init_decompression(archive_read *a,_7zip *zip,_7z_coder *coder1,_7z_coder *coder2)

{
  CPpmd7 *p;
  lzma_filter *filter;
  uchar uVar1;
  UInt32 size;
  unsigned_long uVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  lzma_ret ret;
  Bool BVar6;
  ZSTD_DStream *pZVar7;
  unsigned_long uVar8;
  lzma_vli lVar9;
  char *pcVar10;
  int error_number;
  ulong uVar11;
  lzma_filter filters [4];
  lzma_filter local_98;
  undefined8 local_88 [6];
  long local_58 [5];
  
  uVar8 = coder1->codec;
  zip->codec = uVar8;
  zip->codec2 = 0xffffffffffffffff;
  if ((long)uVar8 < 0x303011b) {
    if ((long)uVar8 < 0x30101) {
      if ((long)uVar8 < 10) {
        if (uVar8 == 0) goto LAB_0019777e;
LAB_0019771b:
        if (uVar8 == 3) {
LAB_001979eb:
          pcVar10 = "Unexpected codec ID: %lX";
          goto LAB_001979fd;
        }
      }
      else {
LAB_0019794e:
        if (uVar8 == 10) goto LAB_001979eb;
        if (uVar8 == 0x21) goto LAB_00197962;
      }
    }
    else if ((long)uVar8 < 0x40108) {
      if (uVar8 == 0x30101) {
LAB_00197962:
        if (zip->lzstream_valid != 0) {
          lzma_end(&zip->lzstream);
          zip->lzstream_valid = 0;
        }
        iVar5 = 0;
        if (coder2 == (_7z_coder *)0x0) goto LAB_00197bb0;
        uVar8 = coder2->codec;
        zip->codec2 = uVar8;
        local_98.options = (long *)0x0;
        if ((long)uVar8 < 0x3030401) {
          if ((long)uVar8 < 0x303011b) {
            if (uVar8 == 3) {
              if (coder2->propertiesSize != 1) {
                pcVar10 = "Invalid Delta parameter";
LAB_00197d4e:
                archive_set_error(&a->archive,-1,pcVar10);
                return -0x19;
              }
              local_98.id = 3;
              local_98.options = local_58;
              local_58[1] = 0;
              local_58[2] = 0;
              local_58[3] = 0;
              local_58[4] = 0;
              local_58[0] = (ulong)(*coder2->properties + 1) << 0x20;
            }
            else {
              if (uVar8 != 0x3030103) {
LAB_00197c5b:
                pcVar10 = "Unexpected codec ID: %lX";
                goto LAB_001979fd;
              }
              if (zip->codec != 0x21) {
                zip->bcj_state = 0;
                zip->bcj_prevPosT = 0xffffffffffffffff;
                zip->bcj_prevMask = 0;
                zip->bcj_ip = 5;
                iVar5 = 0;
                goto LAB_00197bb0;
              }
              local_98.id = 4;
            }
          }
          else {
            if (uVar8 == 0x303011b) {
              zip->bcj_state = 0;
              iVar5 = 0;
              goto LAB_00197bb0;
            }
            if (uVar8 != 0x3030205) goto LAB_00197c5b;
            local_98.id = 5;
          }
        }
        else if ((long)uVar8 < 0x3030701) {
          if (uVar8 == 0x3030401) {
            local_98.id = 6;
          }
          else {
            if (uVar8 != 0x3030501) goto LAB_00197c5b;
            local_98.id = 7;
          }
        }
        else if (uVar8 == 0x3030701) {
          local_98.id = 8;
        }
        else {
          if (uVar8 != 0x3030805) goto LAB_00197c5b;
          local_98.id = 9;
        }
        iVar5 = 1;
LAB_00197bb0:
        uVar11 = (ulong)(uint)(iVar5 << 4);
        filter = (lzma_filter *)((long)&local_98.id + uVar11);
        lVar9 = 0x4000000000000001;
        if (zip->codec == 0x21) {
          lVar9 = 0x21;
        }
        filter->id = lVar9;
        *(undefined8 *)((long)local_88 + (uVar11 - 8)) = 0;
        ret = lzma_properties_decode
                        (filter,(lzma_allocator *)0x0,coder1->properties,coder1->propertiesSize);
        if (ret == LZMA_OK) {
          *(undefined8 *)((long)local_88 + uVar11) = 0xffffffffffffffff;
          *(undefined8 *)((long)local_88 + uVar11 + 8) = 0;
          ret = lzma_raw_decoder(&zip->lzstream,&local_98);
          free(*(void **)((long)local_88 + (uVar11 - 8)));
          if (ret == LZMA_OK) {
            zip->lzstream_valid = 1;
            (zip->lzstream).total_in = 0;
            (zip->lzstream).total_out = 0;
            return 0;
          }
        }
        set_error(a,ret);
        return -0x19;
      }
      if (uVar8 == 0x30401) goto LAB_0019777e;
    }
    else if ((uVar8 == 0x40108) || (uVar8 == 0x40202)) {
LAB_0019777e:
      if (coder2 != (_7z_coder *)0x0) {
        uVar2 = coder2->codec;
        if ((long)uVar2 < 0x303011b) {
          if ((uVar2 != 10) && (uVar2 != 0x3030103)) {
LAB_00197a4c:
            archive_set_error(&a->archive,-1,"Unsupported filter %lx for %lx");
            return -0x19;
          }
        }
        else if ((uVar2 != 0x303011b) && (uVar2 != 0x3030501)) goto LAB_00197a4c;
        zip->codec2 = uVar2;
        zip->bcj_state = 0;
        if (uVar2 == 0x3030501) {
          uVar4 = 8;
        }
        else {
          if (uVar2 != 0x3030103) goto LAB_00197810;
          zip->bcj_state = 0;
          zip->bcj_prevPosT = 0xffffffffffffffff;
          zip->bcj_prevMask = 0;
          uVar4 = 5;
        }
        zip->bcj_ip = uVar4;
      }
LAB_00197810:
      if ((long)uVar8 < 0x303011b) {
        if ((long)uVar8 < 0x30101) {
          if (9 < (long)uVar8) goto LAB_0019794e;
          if (uVar8 == 0) {
            return 0;
          }
          goto LAB_0019771b;
        }
        if (0x40107 < (long)uVar8) {
          if (uVar8 == 0x40108) {
            if (zip->stream_valid == 0) {
              iVar5 = cm_zlib_inflateInit2_(&zip->stream,-0xf,"1.3.1",0x70);
            }
            else {
              iVar5 = cm_zlib_inflateReset(&zip->stream);
            }
            if (iVar5 == 0) {
              zip->stream_valid = 1;
              (zip->stream).total_in = 0;
              (zip->stream).total_out = 0;
              return 0;
            }
            pcVar10 = "Couldn\'t initialize zlib stream.";
            goto LAB_00197d4e;
          }
          if (uVar8 == 0x40202) {
            if (zip->bzstream_valid != 0) {
              BZ2_bzDecompressEnd(&zip->bzstream);
              zip->bzstream_valid = 0;
            }
            iVar5 = BZ2_bzDecompressInit(&zip->bzstream,0,0);
            if (iVar5 == -3) {
              iVar5 = BZ2_bzDecompressInit(&zip->bzstream,0,1);
            }
            pcVar10 = "??";
            error_number = -1;
            switch(iVar5) {
            case 0:
              zip->bzstream_valid = 1;
              (zip->bzstream).total_in_lo32 = 0;
              (zip->bzstream).total_in_hi32 = 0;
              (zip->bzstream).total_out_lo32 = 0;
              (zip->bzstream).total_out_hi32 = 0;
              return 0;
            case -9:
              pcVar10 = "mis-compiled library";
              break;
            case -3:
              pcVar10 = "out of memory";
              error_number = 0xc;
              break;
            case -2:
              pcVar10 = "invalid setup parameter";
            }
            archive_set_error(&a->archive,error_number,
                              "Internal error initializing decompressor: %s",pcVar10);
            zip->bzstream_valid = 0;
            return -0x19;
          }
          goto LAB_00197681;
        }
        if (uVar8 == 0x30101) goto LAB_00197962;
        if (uVar8 == 0x30401) {
          if (zip->ppmd7_valid != 0) {
            Ppmd7_Free(&zip->ppmd7_context);
            zip->ppmd7_valid = 0;
          }
          if (4 < coder1->propertiesSize) {
            uVar1 = *coder1->properties;
            if ((0xc0 < (byte)(uVar1 + 0xbf)) &&
               (size = *(UInt32 *)(coder1->properties + 1), 0x823 < size + 0x24)) {
              p = &zip->ppmd7_context;
              Ppmd7_Construct(p);
              BVar6 = Ppmd7_Alloc(p,size);
              if (BVar6 == 0) {
                bVar3 = false;
                archive_set_error(&a->archive,0xc,"Coludn\'t allocate memory for PPMd");
                iVar5 = -0x1e;
              }
              else {
                Ppmd7_Init(p,(uint)uVar1);
                Ppmd7z_RangeDec_CreateVTable(&zip->range_dec);
                zip->ppmd7_valid = 1;
                iVar5 = 0;
                zip->ppmd7_stat = 0;
                (zip->ppstream).overconsumed = 0;
                (zip->ppstream).total_in = 0;
                (zip->ppstream).total_out = 0;
                bVar3 = true;
              }
              goto LAB_00197ac8;
            }
          }
          bVar3 = false;
          archive_set_error(&a->archive,-1,"Malformed PPMd parameter");
          iVar5 = -0x19;
LAB_00197ac8:
          if (bVar3) {
            return 0;
          }
          return iVar5;
        }
      }
      else {
        if ((long)uVar8 < 0x3030805) goto LAB_00197614;
        if (0x6f10100 < (long)uVar8) goto LAB_001976a0;
        if (uVar8 == 0x3030805) goto LAB_001979eb;
        if (uVar8 == 0x4f71101) {
          if (zip->zstdstream_valid != 0) {
            ZSTD_freeDStream(zip->zstd_dstream);
            zip->zstdstream_valid = 0;
          }
          pZVar7 = ZSTD_createDStream();
          zip->zstd_dstream = pZVar7;
          zip->zstdstream_valid = 1;
          return 0;
        }
      }
    }
    else {
LAB_00197681:
      if (uVar8 == 0x3030103) goto LAB_001979eb;
    }
  }
  else if ((long)uVar8 < 0x3030805) {
LAB_00197614:
    if ((long)uVar8 < 0x3030401) {
      if ((uVar8 == 0x303011b) || (uVar8 == 0x3030205)) goto LAB_001979eb;
    }
    else if ((uVar8 == 0x3030401) || ((uVar8 == 0x3030501 || (uVar8 == 0x3030701))))
    goto LAB_001979eb;
  }
  else {
    if ((long)uVar8 < 0x6f10101) {
      if (uVar8 != 0x3030805) {
        if (uVar8 != 0x4f71101) goto LAB_00197ad6;
        goto LAB_0019777e;
      }
      goto LAB_001979eb;
    }
LAB_001976a0:
    if (((uVar8 == 0x6f10101) || (uVar8 == 0x6f10303)) || (uVar8 == 0x6f10701)) {
      if (a->entry != (archive_entry *)0x0) {
        archive_entry_set_is_metadata_encrypted(a->entry,'\x01');
        archive_entry_set_is_data_encrypted(a->entry,'\x01');
        zip->has_encrypted_entries = 1;
      }
      uVar8 = zip->codec;
      pcVar10 = "Crypto codec not supported yet (ID: 0x%lX)";
      goto LAB_001979fd;
    }
  }
LAB_00197ad6:
  pcVar10 = "Unknown codec ID: %lX";
LAB_001979fd:
  archive_set_error(&a->archive,-1,pcVar10,uVar8);
  return -0x19;
}

Assistant:

static int
init_decompression(struct archive_read *a, struct _7zip *zip,
    const struct _7z_coder *coder1, const struct _7z_coder *coder2)
{
	int r;

	zip->codec = coder1->codec;
	zip->codec2 = -1;

	switch (zip->codec) {
	case _7Z_COPY:
	case _7Z_BZ2:
	case _7Z_DEFLATE:
	case _7Z_ZSTD:
	case _7Z_PPMD:
		if (coder2 != NULL) {
			if (coder2->codec != _7Z_X86 &&
			    coder2->codec != _7Z_X86_BCJ2 &&
			    coder2->codec != _7Z_ARM &&
			    coder2->codec != _7Z_ARM64) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Unsupported filter %lx for %lx",
				    coder2->codec, coder1->codec);
				return (ARCHIVE_FAILED);
			}
			zip->codec2 = coder2->codec;
			zip->bcj_state = 0;
			if (coder2->codec == _7Z_X86)
				x86_Init(zip);
			else if (coder2->codec == _7Z_ARM)
				arm_Init(zip);
		}
		break;
	default:
		break;
	}

	switch (zip->codec) {
	case _7Z_COPY:
		break;

	case _7Z_LZMA: case _7Z_LZMA2:
#ifdef HAVE_LZMA_H
#if LZMA_VERSION_MAJOR >= 5
/* Effectively disable the limiter. */
#define LZMA_MEMLIMIT   UINT64_MAX
#else
/* NOTE: This needs to check memory size which running system has. */
#define LZMA_MEMLIMIT   (1U << 30)
#endif
	{
		lzma_options_delta delta_opt;
		lzma_filter filters[LZMA_FILTERS_MAX], *ff;
		int fi = 0;

		if (zip->lzstream_valid) {
			lzma_end(&(zip->lzstream));
			zip->lzstream_valid = 0;
		}

		/*
		 * NOTE: liblzma incompletely handle the BCJ+LZMA compressed
		 * data made by 7-Zip because 7-Zip does not add End-Of-
		 * Payload Marker(EOPM) at the end of LZMA compressed data,
		 * and so liblzma cannot know the end of the compressed data
		 * without EOPM. So consequently liblzma will not return last
		 * three or four bytes of uncompressed data because
		 * LZMA_FILTER_X86 filter does not handle input data if its
		 * data size is less than five bytes. If liblzma detect EOPM
		 * or know the uncompressed data size, liblzma will flush out
		 * the remaining that three or four bytes of uncompressed
		 * data. That is why we have to use our converting program
		 * for BCJ+LZMA. If we were able to tell the uncompressed
		 * size to liblzma when using lzma_raw_decoder() liblzma
		 * could correctly deal with BCJ+LZMA. But unfortunately
		 * there is no way to do that.
		 * Discussion about this can be found at XZ Utils forum.
		 */
		if (coder2 != NULL) {
			zip->codec2 = coder2->codec;

			filters[fi].options = NULL;
			switch (zip->codec2) {
			case _7Z_X86:
				if (zip->codec == _7Z_LZMA2) {
					filters[fi].id = LZMA_FILTER_X86;
					fi++;
				} else
					/* Use our filter. */
					x86_Init(zip);
				break;
			case _7Z_X86_BCJ2:
				/* Use our filter. */
				zip->bcj_state = 0;
				break;
			case _7Z_DELTA:
				if (coder2->propertiesSize != 1) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Invalid Delta parameter");
					return (ARCHIVE_FAILED);
				}
				filters[fi].id = LZMA_FILTER_DELTA;
				memset(&delta_opt, 0, sizeof(delta_opt));
				delta_opt.type = LZMA_DELTA_TYPE_BYTE;
				delta_opt.dist =
				    (uint32_t)coder2->properties[0] + 1;
				filters[fi].options = &delta_opt;
				fi++;
				break;
			/* Following filters have not been tested yet. */
			case _7Z_POWERPC:
				filters[fi].id = LZMA_FILTER_POWERPC;
				fi++;
				break;
			case _7Z_IA64:
				filters[fi].id = LZMA_FILTER_IA64;
				fi++;
				break;
			case _7Z_ARM:
				filters[fi].id = LZMA_FILTER_ARM;
				fi++;
				break;
			case _7Z_ARMTHUMB:
				filters[fi].id = LZMA_FILTER_ARMTHUMB;
				fi++;
				break;
#ifdef LZMA_FILTER_ARM64
			case _7Z_ARM64:
				filters[fi].id = LZMA_FILTER_ARM64;
				fi++;
				break;
#endif
			case _7Z_SPARC:
				filters[fi].id = LZMA_FILTER_SPARC;
				fi++;
				break;
			default:
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Unexpected codec ID: %lX", zip->codec2);
				return (ARCHIVE_FAILED);
			}
		}

		if (zip->codec == _7Z_LZMA2)
			filters[fi].id = LZMA_FILTER_LZMA2;
		else
			filters[fi].id = LZMA_FILTER_LZMA1;
		filters[fi].options = NULL;
		ff = &filters[fi];
		r = lzma_properties_decode(&filters[fi], NULL,
		    coder1->properties, (size_t)coder1->propertiesSize);
		if (r != LZMA_OK) {
			set_error(a, r);
			return (ARCHIVE_FAILED);
		}
		fi++;

		filters[fi].id = LZMA_VLI_UNKNOWN;
		filters[fi].options = NULL;
		r = lzma_raw_decoder(&(zip->lzstream), filters);
		free(ff->options);
		if (r != LZMA_OK) {
			set_error(a, r);
			return (ARCHIVE_FAILED);
		}
		zip->lzstream_valid = 1;
		zip->lzstream.total_in = 0;
		zip->lzstream.total_out = 0;
		break;
	}
#else
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "LZMA codec is unsupported");
		return (ARCHIVE_FAILED);
#endif
	case _7Z_BZ2:
#if defined(HAVE_BZLIB_H) && defined(BZ_CONFIG_ERROR)
		if (zip->bzstream_valid) {
			BZ2_bzDecompressEnd(&(zip->bzstream));
			zip->bzstream_valid = 0;
		}
		r = BZ2_bzDecompressInit(&(zip->bzstream), 0, 0);
		if (r == BZ_MEM_ERROR)
			r = BZ2_bzDecompressInit(&(zip->bzstream), 0, 1);
		if (r != BZ_OK) {
			int err = ARCHIVE_ERRNO_MISC;
			const char *detail = NULL;
			switch (r) {
			case BZ_PARAM_ERROR:
				detail = "invalid setup parameter";
				break;
			case BZ_MEM_ERROR:
				err = ENOMEM;
				detail = "out of memory";
				break;
			case BZ_CONFIG_ERROR:
				detail = "mis-compiled library";
				break;
			}
			archive_set_error(&a->archive, err,
			    "Internal error initializing decompressor: %s",
			    detail != NULL ? detail : "??");
			zip->bzstream_valid = 0;
			return (ARCHIVE_FAILED);
		}
		zip->bzstream_valid = 1;
		zip->bzstream.total_in_lo32 = 0;
		zip->bzstream.total_in_hi32 = 0;
		zip->bzstream.total_out_lo32 = 0;
		zip->bzstream.total_out_hi32 = 0;
		break;
#else
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "BZ2 codec is unsupported");
		return (ARCHIVE_FAILED);
#endif
	case _7Z_ZSTD:
	{
#if defined(HAVE_ZSTD_H)
		if (zip->zstdstream_valid) {
			ZSTD_freeDStream(zip->zstd_dstream);
			zip->zstdstream_valid = 0;
		}
		zip->zstd_dstream = ZSTD_createDStream();
		zip->zstdstream_valid = 1;
		break;
#else
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			"ZSTD codec is unsupported");
		return (ARCHIVE_FAILED);
#endif
	}
	case _7Z_DEFLATE:
#ifdef HAVE_ZLIB_H
		if (zip->stream_valid)
			r = inflateReset(&(zip->stream));
		else
			r = inflateInit2(&(zip->stream),
			    -15 /* Don't check for zlib header */);
		if (r != Z_OK) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Couldn't initialize zlib stream.");
			return (ARCHIVE_FAILED);
		}
		zip->stream_valid = 1;
		zip->stream.total_in = 0;
		zip->stream.total_out = 0;
		break;
#else
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "DEFLATE codec is unsupported");
		return (ARCHIVE_FAILED);
#endif
	case _7Z_PPMD:
	{
		unsigned order;
		uint32_t msize;

		if (zip->ppmd7_valid) {
			__archive_ppmd7_functions.Ppmd7_Free(
			    &zip->ppmd7_context);
			zip->ppmd7_valid = 0;
		}

		if (coder1->propertiesSize < 5) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Malformed PPMd parameter");
			return (ARCHIVE_FAILED);
		}
		order = coder1->properties[0];
		msize = archive_le32dec(&(coder1->properties[1]));
		if (order < PPMD7_MIN_ORDER || order > PPMD7_MAX_ORDER ||
		    msize < PPMD7_MIN_MEM_SIZE || msize > PPMD7_MAX_MEM_SIZE) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Malformed PPMd parameter");
			return (ARCHIVE_FAILED);
		}
		__archive_ppmd7_functions.Ppmd7_Construct(&zip->ppmd7_context);
		r = __archive_ppmd7_functions.Ppmd7_Alloc(
			&zip->ppmd7_context, msize);
		if (r == 0) {
			archive_set_error(&a->archive, ENOMEM,
			    "Coludn't allocate memory for PPMd");
			return (ARCHIVE_FATAL);
		}
		__archive_ppmd7_functions.Ppmd7_Init(
			&zip->ppmd7_context, order);
		__archive_ppmd7_functions.Ppmd7z_RangeDec_CreateVTable(
			&zip->range_dec);
		zip->ppmd7_valid = 1;
		zip->ppmd7_stat = 0;
		zip->ppstream.overconsumed = 0;
		zip->ppstream.total_in = 0;
		zip->ppstream.total_out = 0;
		break;
	}
	case _7Z_X86:
	case _7Z_X86_BCJ2:
	case _7Z_POWERPC:
	case _7Z_IA64:
	case _7Z_ARM:
	case _7Z_ARMTHUMB:
	case _7Z_ARM64:
	case _7Z_SPARC:
	case _7Z_DELTA:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Unexpected codec ID: %lX", zip->codec);
		return (ARCHIVE_FAILED);
	case _7Z_CRYPTO_MAIN_ZIP:
	case _7Z_CRYPTO_RAR_29:
	case _7Z_CRYPTO_AES_256_SHA_256:
		if (a->entry) {
			archive_entry_set_is_metadata_encrypted(a->entry, 1);
			archive_entry_set_is_data_encrypted(a->entry, 1);
			zip->has_encrypted_entries = 1;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Crypto codec not supported yet (ID: 0x%lX)", zip->codec);
		return (ARCHIVE_FAILED);
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Unknown codec ID: %lX", zip->codec);
		return (ARCHIVE_FAILED);
	}

	return (ARCHIVE_OK);
}